

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.h
# Opt level: O0

Field<unsigned_char> * __thiscall
ki::dml::Record::add_field<unsigned_char>(Record *this,string *name,bool transferable)

{
  bool bVar1;
  mapped_type *ppFVar2;
  Record *this_00;
  Record *local_b8;
  string local_88 [32];
  Record *local_68;
  Field<unsigned_char> *field;
  FieldBase *field_1;
  string local_48 [39];
  byte local_21;
  string *psStack_20;
  bool transferable_local;
  string *name_local;
  Record *this_local;
  
  local_21 = transferable;
  psStack_20 = name;
  name_local = (string *)this;
  std::__cxx11::string::string(local_48,(string *)name);
  bVar1 = has_field(this,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  if (bVar1) {
    ppFVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
              ::at(&this->m_field_map,name);
    field = (Field<unsigned_char> *)*ppFVar2;
    bVar1 = FieldBase::is_type<unsigned_char>((FieldBase *)field);
    if (bVar1) {
      if (field == (Field<unsigned_char> *)0x0) {
        local_b8 = (Record *)0x0;
      }
      else {
        local_b8 = (Record *)
                   __dynamic_cast(field,&FieldBase::typeinfo,&Field<unsigned_char>::typeinfo,0);
      }
      this_local = local_b8;
    }
    else {
      this_local = (Record *)0x0;
    }
  }
  else {
    this_00 = (Record *)operator_new(0x40);
    std::__cxx11::string::string(local_88,(string *)name);
    Field<unsigned_char>::Field((Field<unsigned_char> *)this_00,(string *)local_88);
    std::__cxx11::string::~string(local_88);
    *(byte *)&(this_00->m_field_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_21 & 1;
    local_68 = this_00;
    add_field(this,(FieldBase *)this_00);
    this_local = local_68;
  }
  return (Field<unsigned_char> *)this_local;
}

Assistant:

Field<ValueT> *add_field(std::string name, bool transferable = true)
		{
			// Does this field already exist?
			if (has_field(name))
			{
				// Return nullptr if the type is not the same
				auto *field = m_field_map.at(name);
				if (!field->is_type<ValueT>())
					return nullptr;
				return dynamic_cast<Field<ValueT> *>(field);
			}

			// Create the field
			auto *field = new Field<ValueT>(name);
			field->m_transferable = transferable;
			add_field(field);
			return field;
		}